

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stackstring.hpp
# Opt level: O1

void __thiscall
StackString<32UL,_char16_t>::ReallocateBuffer(StackString<32UL,_char16_t> *this,SIZE_T count)

{
  char16_t *pcVar1;
  long lVar2;
  long lVar3;
  
  pcVar1 = (char16_t *)PAL_malloc(count * 2 + 2);
  if (pcVar1 == (char16_t *)0x0) {
    SetLastError(8);
    if ((StackString<32UL,_char16_t> *)this->m_buffer != this) {
      PAL_free((StackString<32UL,_char16_t> *)this->m_buffer);
    }
    this->m_buffer = (char16_t *)0x0;
    lVar2 = 0x58;
    lVar3 = 0;
  }
  else {
    if ((StackString<32UL,_char16_t> *)this->m_buffer != this) {
      PAL_free((StackString<32UL,_char16_t> *)this->m_buffer);
    }
    this->m_buffer = pcVar1;
    this->m_count = count;
    lVar3 = count + 1;
    lVar2 = 0x50;
  }
  *(long *)((long)this->m_innerBuffer + lVar2) = lVar3;
  return;
}

Assistant:

void ReallocateBuffer(SIZE_T count)
    {
        // count is always > STACKCOUNT here.
        T * newBuffer = (T *)PAL_malloc((count + 1) * sizeof(T));
        if (NULL == newBuffer)
        {
            SetLastError(ERROR_NOT_ENOUGH_MEMORY);

            DeleteBuffer();
            m_count = 0;

            return;
        }

        DeleteBuffer();
        m_buffer = newBuffer;
        m_count = count;
        m_size = count+1;

        return;
    }